

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O0

REF_STATUS
ref_edge_rcm_queue(REF_EDGE ref_edge,REF_INT node,REF_INT *o2n,REF_INT *n2o,REF_INT *ndone,
                  REF_INT *queue,REF_INT *nqueue)

{
  uint uVar1;
  REF_INT local_78;
  REF_INT local_74;
  int local_70;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT nhere;
  REF_INT degree;
  REF_INT other;
  REF_INT ref;
  REF_INT item;
  REF_ADJ ref_adj;
  REF_INT *queue_local;
  REF_INT *ndone_local;
  REF_INT *n2o_local;
  REF_INT *o2n_local;
  REF_EDGE pRStack_18;
  REF_INT node_local;
  REF_EDGE ref_edge_local;
  
  _ref = ref_edge->adj;
  n2o[*ndone] = node;
  o2n[node] = *ndone;
  *ndone = *ndone + 1;
  ref_private_macro_code_rss_1 = 0;
  if ((node < 0) || (_ref->nnode <= node)) {
    local_70 = -1;
  }
  else {
    local_70 = _ref->first[node];
  }
  other = local_70;
  if (local_70 == -1) {
    local_74 = -1;
  }
  else {
    local_74 = _ref->item[local_70].ref;
  }
  degree = local_74;
  ref_adj = (REF_ADJ)queue;
  queue_local = ndone;
  ndone_local = n2o;
  n2o_local = o2n;
  o2n_local._4_4_ = node;
  pRStack_18 = ref_edge;
  do {
    if (other == -1) {
      return 0;
    }
    nhere = pRStack_18->e2n[degree << 1];
    if (n2o_local[nhere] == -1) {
      n2o_local[nhere] = -2;
      uVar1 = ref_adj_degree(_ref,nhere,&ref_private_macro_code_rss);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
               0x302,"ref_edge_rcm_queue",(ulong)uVar1,"deg");
        return uVar1;
      }
      uVar1 = ref_edge_rcm_queue_node
                        (nhere,ref_private_macro_code_rss,&ref_adj->nnode,nqueue,
                         &ref_private_macro_code_rss_1);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
               0x304,"ref_edge_rcm_queue",(ulong)uVar1,"queue n0");
        return uVar1;
      }
    }
    nhere = pRStack_18->e2n[degree * 2 + 1];
    if (n2o_local[nhere] == -1) {
      n2o_local[nhere] = -2;
      uVar1 = ref_adj_degree(_ref,nhere,&ref_private_macro_code_rss);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
               0x309,"ref_edge_rcm_queue",(ulong)uVar1,"deg");
        return uVar1;
      }
      uVar1 = ref_edge_rcm_queue_node
                        (nhere,ref_private_macro_code_rss,&ref_adj->nnode,nqueue,
                         &ref_private_macro_code_rss_1);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
               0x30b,"ref_edge_rcm_queue",(ulong)uVar1,"queue n1");
        return uVar1;
      }
    }
    other = _ref->item[other].next;
    if (other == -1) {
      local_78 = -1;
    }
    else {
      local_78 = _ref->item[other].ref;
    }
    degree = local_78;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_edge_rcm_queue(REF_EDGE ref_edge, REF_INT node,
                                             REF_INT *o2n, REF_INT *n2o,
                                             REF_INT *ndone, REF_INT *queue,
                                             REF_INT *nqueue) {
  REF_ADJ ref_adj = ref_edge_adj(ref_edge);
  REF_INT item, ref, other, degree;
  REF_INT nhere;
  n2o[(*ndone)] = node;
  o2n[node] = (*ndone);
  (*ndone)++;
  nhere = 0;

  /* printf("%d done %d nq %d\n", *ndone, node, *nqueue); */

  each_ref_adj_node_item_with_ref(ref_adj, node, item, ref) {
    other = ref_edge_e2n(ref_edge, 0, ref);
    if (REF_EMPTY == o2n[other]) {
      o2n[other] = -2; /* mark as queued */
      RSS(ref_adj_degree(ref_adj, other, &degree), "deg");
      RSS(ref_edge_rcm_queue_node(other, degree, queue, nqueue, &nhere),
          "queue n0");
    }
    other = ref_edge_e2n(ref_edge, 1, ref);
    if (REF_EMPTY == o2n[other]) {
      o2n[other] = -2; /* mark as queued */
      RSS(ref_adj_degree(ref_adj, other, &degree), "deg");
      RSS(ref_edge_rcm_queue_node(other, degree, queue, nqueue, &nhere),
          "queue n1");
    }
  }

  return REF_SUCCESS;
}